

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressEnd(ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ZSTD_compressionStage_e ZVar1;
  ZSTD_CCtx_params params;
  size_t sVar2;
  size_t sVar3;
  XXH64_hash_t XVar4;
  long lVar5;
  undefined4 *puVar6;
  ZSTD_CCtx_params *pZVar7;
  undefined8 *puVar8;
  ulong dstCapacity_00;
  undefined4 *dst_00;
  byte bVar9;
  size_t sStackY_c0;
  ZSTD_format_e ZVar10;
  undefined1 auVar11 [28];
  undefined1 auVar12 [12];
  undefined1 auVar13 [24];
  undefined1 in_stack_ffffffffffffff4c [124];
  undefined1 auVar14 [24];
  
  bVar9 = 0;
  ZVar10 = ZSTD_f_zstd1_magicless;
  sVar2 = ZSTD_compressContinue_internal(cctx,dst,dstCapacity,src,srcSize,1,1);
  sStackY_c0 = sVar2;
  if (sVar2 < 0xffffffffffffff89) {
    ZVar1 = cctx->stage;
    if (ZVar1 == ZSTDcs_created) {
      sStackY_c0 = 0xffffffffffffffc4;
    }
    else {
      dst_00 = (undefined4 *)((long)dst + sVar2);
      dstCapacity_00 = dstCapacity - sVar2;
      puVar6 = dst_00;
      if (ZVar1 != ZSTDcs_ending) {
        if (ZVar1 == ZSTDcs_init) {
          pZVar7 = &cctx->appliedParams;
          puVar8 = (undefined8 *)&stack0xffffffffffffff48;
          for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
            *puVar8 = *(undefined8 *)pZVar7;
            pZVar7 = (ZSTD_CCtx_params *)((long)pZVar7 + (ulong)bVar9 * -0x10 + 8);
            puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
          }
          auVar11 = in_stack_ffffffffffffff4c._0_28_;
          auVar12 = in_stack_ffffffffffffff4c._28_12_;
          auVar13 = in_stack_ffffffffffffff4c._76_24_;
          auVar14 = in_stack_ffffffffffffff4c._100_24_;
          params.cParams.windowLog = auVar11._0_4_;
          params.cParams.chainLog = auVar11._4_4_;
          params.cParams.hashLog = auVar11._8_4_;
          params.cParams.searchLog = auVar11._12_4_;
          params.cParams.minMatch = auVar11._16_4_;
          params.cParams.targetLength = auVar11._20_4_;
          params.cParams.strategy = auVar11._24_4_;
          params.fParams.contentSizeFlag = auVar12._0_4_;
          params.fParams.checksumFlag = auVar12._4_4_;
          params.fParams.noDictIDFlag = auVar12._8_4_;
          params.compressionLevel = in_stack_ffffffffffffff4c._40_4_;
          params.forceWindow = in_stack_ffffffffffffff4c._44_4_;
          params.attachDictPref = in_stack_ffffffffffffff4c._48_4_;
          params.nbWorkers = in_stack_ffffffffffffff4c._52_4_;
          params._60_4_ = in_stack_ffffffffffffff4c._56_4_;
          params.jobSize = in_stack_ffffffffffffff4c._60_8_;
          params.overlapLog = in_stack_ffffffffffffff4c._68_4_;
          params.rsyncable = in_stack_ffffffffffffff4c._72_4_;
          params.ldmParams.enableLdm = auVar13._0_4_;
          params.ldmParams.hashLog = auVar13._4_4_;
          params.ldmParams.bucketSizeLog = auVar13._8_4_;
          params.ldmParams.minMatchLength = auVar13._12_4_;
          params.ldmParams.hashRateLog = auVar13._16_4_;
          params.ldmParams.windowLog = auVar13._20_4_;
          params.customMem.customAlloc = (ZSTD_allocFunction)auVar14._0_8_;
          params.customMem.customFree = (ZSTD_freeFunction)auVar14._8_8_;
          params.customMem.opaque = (void *)auVar14._16_8_;
          params.format = ZVar10;
          sVar3 = ZSTD_writeFrameHeader(dst_00,dstCapacity_00,params,0,0);
          if (0xffffffffffffff88 < sVar3) {
            return sVar3;
          }
          dstCapacity_00 = dstCapacity_00 - sVar3;
          cctx->stage = ZSTDcs_ongoing;
          puVar6 = (undefined4 *)(sVar3 + (long)dst_00);
        }
        if (dstCapacity_00 < 4) {
          return 0xffffffffffffffba;
        }
        *puVar6 = 1;
        dstCapacity_00 = dstCapacity_00 - 3;
        puVar6 = (undefined4 *)((long)puVar6 + 3);
      }
      if ((cctx->appliedParams).fParams.checksumFlag != 0) {
        XVar4 = XXH64_digest(&cctx->xxhState);
        if (dstCapacity_00 < 4) {
          return 0xffffffffffffffba;
        }
        *puVar6 = (int)XVar4;
        puVar6 = puVar6 + 1;
      }
      cctx->stage = ZSTDcs_created;
      sStackY_c0 = (long)puVar6 - (long)dst_00;
      if (sStackY_c0 < 0xffffffffffffff89) {
        if ((cctx->pledgedSrcSizePlusOne == 0) ||
           (cctx->pledgedSrcSizePlusOne == cctx->consumedSrcSize + 1)) {
          sStackY_c0 = sStackY_c0 + sVar2;
        }
        else {
          sStackY_c0 = 0xffffffffffffffb8;
        }
      }
    }
  }
  return sStackY_c0;
}

Assistant:

size_t ZSTD_compressEnd (ZSTD_CCtx* cctx,
                         void* dst, size_t dstCapacity,
                   const void* src, size_t srcSize)
{
    size_t endResult;
    size_t const cSize = ZSTD_compressContinue_internal(cctx,
                                dst, dstCapacity, src, srcSize,
                                1 /* frame mode */, 1 /* last chunk */);
    if (ZSTD_isError(cSize)) return cSize;
    endResult = ZSTD_writeEpilogue(cctx, (char*)dst + cSize, dstCapacity-cSize);
    if (ZSTD_isError(endResult)) return endResult;
    assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
    if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
        ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
        DEBUGLOG(4, "end of frame : controlling src size");
        if (cctx->pledgedSrcSizePlusOne != cctx->consumedSrcSize+1) {
            DEBUGLOG(4, "error : pledgedSrcSize = %u, while realSrcSize = %u",
                (unsigned)cctx->pledgedSrcSizePlusOne-1, (unsigned)cctx->consumedSrcSize);
            return ERROR(srcSize_wrong);
    }   }
    return cSize + endResult;
}